

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void accumulate_counters_enc_workers(AV1_COMP *cpi,int num_workers)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  EncWorkerData *thread_data;
  AVxWorker *worker;
  int i;
  MACROBLOCK *in_stack_ffffffffffffffd8;
  AV1_COMP *cpi_00;
  int local_10;
  
  for (local_10 = in_ESI + -1; -1 < local_10; local_10 = local_10 + -1) {
    cpi_00 = *(AV1_COMP **)(*(long *)(in_RDI + 0x9ae80) + (long)local_10 * 0x38 + 0x20);
    *(uint *)(in_RDI + 0x9d1f4) =
         *(uint *)(*(long *)&cpi_00->field_0x8 + 0x25d50) | *(uint *)(in_RDI + 0x9d1f4);
    *(uint *)(in_RDI + 0x9d304) =
         *(uint *)(*(long *)&cpi_00->field_0x8 + 0x25d54) | *(uint *)(in_RDI + 0x9d304);
    iVar1 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
    if (iVar1 == 0) {
      av1_accumulate_rtc_counters(cpi_00,in_stack_ffffffffffffffd8);
    }
    *(int *)(in_RDI + 0x9d708) =
         *(int *)(*(long *)&cpi_00->field_0x8 + 0x25690) + *(int *)(in_RDI + 0x9d708);
    if (*(long *)&cpi_00->field_0x8 != in_RDI + 0x15030) {
      if (*(int *)(in_RDI + 0x60b00) != 0) {
        aom_free(cpi_00);
        *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x256b0) = 0;
      }
      if (*(int *)(in_RDI + 0x60ba8) != 0) {
        aom_free(cpi_00);
        *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x256b8) = 0;
      }
    }
    in_stack_ffffffffffffffd8 = *(MACROBLOCK **)&cpi_00->field_0x8;
    av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
    av1_dealloc_mb_data((macroblock *)cpi_00,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    if (0 < local_10) {
      av1_accumulate_frame_counts
                ((FRAME_COUNTS *)(in_RDI + 0x3be90),
                 *(FRAME_COUNTS **)(*(long *)&cpi_00->field_0x8 + 0x25c58));
      accumulate_rd_opt((ThreadData_conflict *)(in_RDI + 0x15030),
                        *(ThreadData_conflict **)&cpi_00->field_0x8);
      *(int *)(in_RDI + 0x3a648) =
           *(int *)(*(long *)&cpi_00->field_0x8 + 0x25618) + *(int *)(in_RDI + 0x3a648);
    }
  }
  return;
}

Assistant:

static inline void accumulate_counters_enc_workers(AV1_COMP *cpi,
                                                   int num_workers) {
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *const worker = &cpi->mt_info.workers[i];
    EncWorkerData *const thread_data = (EncWorkerData *)worker->data1;
    cpi->intrabc_used |= thread_data->td->intrabc_used;
    cpi->deltaq_used |= thread_data->td->deltaq_used;
    // Accumulate rtc counters.
    if (!frame_is_intra_only(&cpi->common))
      av1_accumulate_rtc_counters(cpi, &thread_data->td->mb);
    cpi->palette_pixel_num += thread_data->td->mb.palette_pixels;
    if (thread_data->td != &cpi->td) {
      // Keep these conditional expressions in sync with the corresponding ones
      // in prepare_enc_workers().
      if (cpi->sf.inter_sf.mv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        aom_free(thread_data->td->mv_costs_alloc);
        thread_data->td->mv_costs_alloc = NULL;
      }
      if (cpi->sf.intra_sf.dv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        aom_free(thread_data->td->dv_costs_alloc);
        thread_data->td->dv_costs_alloc = NULL;
      }
    }
    av1_dealloc_mb_data(&thread_data->td->mb, av1_num_planes(&cpi->common));

    // Accumulate counters.
    if (i > 0) {
      av1_accumulate_frame_counts(&cpi->counts, thread_data->td->counts);
      accumulate_rd_opt(&cpi->td, thread_data->td);
      cpi->td.mb.txfm_search_info.txb_split_count +=
          thread_data->td->mb.txfm_search_info.txb_split_count;
#if CONFIG_SPEED_STATS
      cpi->td.mb.txfm_search_info.tx_search_count +=
          thread_data->td->mb.txfm_search_info.tx_search_count;
#endif  // CONFIG_SPEED_STATS
    }
  }
}